

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_setup_connection(connectdata *conn)

{
  Curl_easy *pCVar1;
  CURLcode CVar2;
  void *pvVar3;
  
  pCVar1 = conn->data;
  pvVar3 = (*Curl_ccalloc)(0x18,1);
  (pCVar1->req).protop = pvVar3;
  if (pvVar3 == (void *)0x0) {
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  else {
    conn->tls_upgraded = false;
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

static CURLcode pop3_setup_connection(struct connectdata *conn)
{
  /* Initialise the POP3 layer */
  CURLcode result = pop3_init(conn);
  if(result)
    return result;

  /* Clear the TLS upgraded flag */
  conn->tls_upgraded = FALSE;

  return CURLE_OK;
}